

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  Message *src_text;
  long in_FS_OFFSET;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Int32 result;
  char *var_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  var_local = var;
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message((Message *)&local_38);
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),"The value of environment variable ");
    src_text = Message::operator<<((Message *)&local_38,&var_local);
    bVar1 = ParseInt32(src_text,str,&result);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
    default_val = result;
    if (!bVar1) {
      exit(1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}